

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParsePrefix(State *state)

{
  bool bVar1;
  bool bVar2;
  bool has_something;
  State *state_local;
  
  bVar2 = false;
  while( true ) {
    MaybeAppendSeparator(state);
    bVar1 = ParseTemplateParam(state);
    if (((!bVar1) && (bVar1 = ParseSubstitution(state), !bVar1)) &&
       (bVar1 = ParseUnscopedName(state), !bVar1)) break;
    bVar2 = true;
    MaybeIncreaseNestLevel(state);
  }
  MaybeCancelLastSeparator(state);
  if ((bVar2) && (bVar2 = ParseTemplateArgs(state), bVar2)) {
    state_local._7_1_ = ParsePrefix(state);
  }
  else {
    state_local._7_1_ = true;
  }
  return state_local._7_1_;
}

Assistant:

static bool ParsePrefix(State *state) {
  bool has_something = false;
  while (true) {
    MaybeAppendSeparator(state);
    if (ParseTemplateParam(state) ||
        ParseSubstitution(state) ||
        ParseUnscopedName(state)) {
      has_something = true;
      MaybeIncreaseNestLevel(state);
      continue;
    }
    MaybeCancelLastSeparator(state);
    if (has_something && ParseTemplateArgs(state)) {
      return ParsePrefix(state);
    } else {
      break;
    }
  }
  return true;
}